

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_proceed_to_iret
              (pt_block_decoder *decoder,pt_block *block,pt_insn *insn,pt_insn_ext *iext,
              pt_event *ev)

{
  int iVar1;
  int status;
  pt_event *ev_local;
  pt_insn_ext *iext_local;
  pt_insn *insn_local;
  pt_block *block_local;
  pt_block_decoder *decoder_local;
  
  if ((insn == (pt_insn *)0x0) || (ev == (pt_event *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else {
    if ((ev->field_0x4 & 1) == 0) {
      iVar1 = pt_blk_proceed_to_ip(decoder,block,insn,iext,(ev->variant).enabled.ip);
      if (iVar1 < 1) {
        return iVar1;
      }
      iVar1 = pt_blk_proceed_one_insn(decoder,block,insn,iext);
      if (iVar1 < 1) {
        return iVar1;
      }
    }
    else {
      iVar1 = pt_blk_proceed_to_insn(decoder,block,insn,iext,pt_insn_is_iret);
      if (iVar1 < 1) {
        return iVar1;
      }
      (ev->variant).disabled.ip = insn->ip;
      ev->field_0x4 = ev->field_0x4 & 0xfe;
    }
    decoder_local._4_4_ = 1;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_blk_proceed_to_iret(struct pt_block_decoder *decoder,
				  struct pt_block *block,
				  struct pt_insn *insn,
				  struct pt_insn_ext *iext,
				  struct pt_event *ev)
{
	int status;

	if (!insn || !ev)
		return -pte_internal;

	/* If we don't have an IP, the event binds to the next IRET
	 * instruction.
	 *
	 * If we have an IP it still binds to the next IRET instruction but now
	 * the IP tells us where that instruction is.  This makes most sense
	 * when tracing is disabled and we don't have any other means of
	 * finding the IRET instruction.  We nevertheless distinguish the two
	 * cases, here.
	 *
	 * In both cases, we move beyond the IRET instruction, so it will be
	 * the last instruction in the current block and @decoder->ip will
	 * point to the instruction following it.
	 */
	if (ev->ip_suppressed) {
		status = pt_blk_proceed_to_insn(decoder, block, insn, iext,
						pt_insn_is_iret);
		if (status <= 0)
			return status;

		/* We now know the IP of the IRET instruction corresponding to
		 * this event.  Fill it in to make it more convenient for the
		 * user to process the event.
		 */
		ev->variant.iret.ip = insn->ip;
		ev->ip_suppressed = 0;
	} else {
		status = pt_blk_proceed_to_ip(decoder, block, insn, iext,
					      ev->variant.iret.ip);
		if (status <= 0)
			return status;

		/* We reached the IRET instruction and @decoder->ip points to
		 * it; @insn/@iext still contain the preceding instruction.
		 *
		 * Proceed beyond the IRET to account for it.  Note that we may
		 * still overflow the block, which would cause us to postpone
		 * both instruction and event to the next block.
		 */
		status = pt_blk_proceed_one_insn(decoder, block, insn, iext);
		if (status <= 0)
			return status;
	}

	return 1;
}